

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_new.c
# Opt level: O2

mpt_node * mpt_node_new(size_t len)

{
  ulong uVar1;
  mpt_node *pmVar2;
  size_t __size;
  
  if (len - 0x19 < 0xc0) {
    uVar1 = 0x40;
    do {
      __size = uVar1;
      uVar1 = __size * 2;
    } while (__size < len + 0x28);
  }
  else {
    __size = 0x40;
  }
  pmVar2 = (mpt_node *)malloc(__size);
  if (pmVar2 != (mpt_node *)0x0) {
    pmVar2->prev = (mpt_node *)0x0;
    pmVar2->parent = (mpt_node *)0x0;
    pmVar2->_meta = (mpt_metatype *)0x0;
    pmVar2->next = (mpt_node *)0x0;
    pmVar2->children = (mpt_node *)0x0;
    mpt_identifier_init(&pmVar2->ident,__size - 0x28);
  }
  return pmVar2;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_new(size_t len)
{
	static const size_t preSize = sizeof(MPT_STRUCT(node)) - sizeof(MPT_STRUCT(identifier));
	size_t size;
	MPT_STRUCT(node) *node;
	
	len += preSize;
	size = 8 * sizeof(void *);
	
	/* match node size to identifier */
	if (len > size && len <= 0x100) {
		while (size < len) {
			size *= 2;
		}
	}
	/* use default node allocation size */
	if (!(node = malloc(size))) {
		return 0;
	}
	/* zero relation pointers */
	node->_meta = 0;
	node->next = node->prev = node->parent = node->children = 0;
	
	mpt_identifier_init(&node->ident, size - preSize);
	
	return node;
}